

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O2

Error asmjit::v1_14::VirtMem::releaseDualMapping(DualMapping *dm,size_t size)

{
  Error EVar1;
  Error EVar2;
  
  EVar1 = unmapMemory(dm->rx,size);
  if (dm->rx == dm->rw) {
    EVar2 = 0;
  }
  else {
    EVar2 = unmapMemory(dm->rw,size);
  }
  if (EVar2 == 0 && EVar1 == 0) {
    dm->rx = (void *)0x0;
    dm->rw = (void *)0x0;
    EVar2 = 0;
  }
  else if (EVar1 != 0) {
    EVar2 = EVar1;
  }
  return EVar2;
}

Assistant:

Error releaseDualMapping(DualMapping* dm, size_t size) noexcept {
#if defined(ASMJIT_NO_DUAL_MAPPING)
  DebugUtils::unused(dm, size);
  return DebugUtils::errored(kErrorFeatureNotEnabled);
#else
  return unmapDualMapping(dm, size);
#endif // ASMJIT_NO_DUAL_MAPPING
}